

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O0

bool __thiscall Rml::DataViewIf::Update(DataViewIf *this,DataModel *model)

{
  char cVar1;
  bool bVar2;
  Element *element_00;
  DataExpression *this_00;
  PropertyMap *this_01;
  size_t sVar3;
  Property local_d0;
  key_type local_7b;
  undefined1 local_7a;
  byte local_79;
  undefined1 local_78 [6];
  bool is_visible;
  bool value;
  DataExpressionInterface expr_interface;
  Element *element;
  Variant variant;
  bool result;
  DataModel *model_local;
  DataViewIf *this_local;
  
  variant.data[0x1f] = '\0';
  Variant::Variant((Variant *)&element);
  element_00 = DataView::GetElement((DataView *)this);
  DataExpressionInterface::DataExpressionInterface
            ((DataExpressionInterface *)local_78,model,element_00,(Event *)0x0);
  if (element_00 != (Element *)0x0) {
    this_00 = DataViewCommon::GetExpression(&this->super_DataViewCommon);
    bVar2 = DataExpression::Run(this_00,(DataExpressionInterface *)local_78,(Variant *)&element);
    if (bVar2) {
      local_79 = Variant::Get<bool>((Variant *)&element,false);
      this_01 = Element::GetLocalStyleProperties(element_00);
      local_7b = Display;
      sVar3 = robin_hood::detail::
              Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
              ::count(this_01,&local_7b);
      local_7a = sVar3 == 0;
      if (local_7a != (local_79 & 1)) {
        if ((local_79 & 1) == 0) {
          Property::Property<Rml::Style::Display,Rml::Style::Display>(&local_d0,None);
          Element::SetProperty(element_00,Display,&local_d0);
          Property::~Property(&local_d0);
        }
        else {
          Element::RemoveProperty(element_00,Display);
        }
        variant.data[0x1f] = '\x01';
      }
    }
  }
  cVar1 = variant.data[0x1f];
  Variant::~Variant((Variant *)&element);
  return (bool)(cVar1 & 1);
}

Assistant:

bool DataViewIf::Update(DataModel& model)
{
	bool result = false;
	Variant variant;
	Element* element = GetElement();
	DataExpressionInterface expr_interface(&model, element);

	if (element && GetExpression().Run(expr_interface, variant))
	{
		const bool value = variant.Get<bool>();
		const bool is_visible = (element->GetLocalStyleProperties().count(PropertyId::Display) == 0);
		if (is_visible != value)
		{
			if (value)
				element->RemoveProperty(PropertyId::Display);
			else
				element->SetProperty(PropertyId::Display, Property(Style::Display::None));
			result = true;
		}
	}
	return result;
}